

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void insert_or_append_to_polymap
               (map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                *target_map,int key,co_ord *polygon)

{
  initializer_list<co_ord> __l;
  map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
  *this;
  size_type sVar1;
  mapped_type *this_00;
  co_ord *local_d8;
  pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_b8;
  allocator<co_ord> local_95 [13];
  co_ord *local_88;
  co_ord local_80;
  iterator local_50;
  pointer local_48;
  vector<co_ord,_std::allocator<co_ord>_> polygons;
  co_ord *polygon_local;
  map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
  *pmStack_10;
  int key_local;
  map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
  *target_map_local;
  
  polygons.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = key;
  polygon_local._4_4_ = key;
  pmStack_10 = (map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
                *)target_map;
  sVar1 = std::
          map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
          ::count(target_map,
                  (key_type_conflict *)
                  ((long)&polygons.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 4));
  if (sVar1 == 0) {
    local_88 = &local_80;
    co_ord::co_ord(local_88,polygon);
    local_50 = &local_80;
    local_48 = (pointer)0x1;
    std::allocator<co_ord>::allocator(local_95);
    __l._M_len = (size_type)local_48;
    __l._M_array = local_50;
    std::vector<co_ord,_std::allocator<co_ord>_>::vector
              ((vector<co_ord,_std::allocator<co_ord>_> *)&stack0xffffffffffffffc0,__l,local_95);
    std::allocator<co_ord>::~allocator(local_95);
    local_d8 = (co_ord *)&stack0xffffffffffffffb0;
    do {
      local_d8 = local_d8 + -1;
      co_ord::~co_ord(local_d8);
      this = pmStack_10;
    } while (local_d8 != &local_80);
    std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
    pair<int_&,_std::vector<co_ord,_std::allocator<co_ord>_>_&,_true>
              (&local_b8,(int *)((long)&polygon_local + 4),
               (vector<co_ord,_std::allocator<co_ord>_> *)&stack0xffffffffffffffc0);
    std::
    map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
    ::insert<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>(this,&local_b8);
    std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::~pair(&local_b8);
    std::vector<co_ord,_std::allocator<co_ord>_>::~vector
              ((vector<co_ord,_std::allocator<co_ord>_> *)&stack0xffffffffffffffc0);
  }
  else {
    polygons.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = polygon_local._4_4_;
    this_00 = std::
              map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
              ::operator[]((map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                            *)pmStack_10,
                           (key_type_conflict *)
                           &polygons.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this_00,polygon);
  }
  return;
}

Assistant:

void insert_or_append_to_polymap(
    std::map<unsigned int, std::vector<co_ord>> &target_map, int key,
    const co_ord &polygon)
{
  if (target_map.count(key) > 0) {
    target_map[key].push_back(polygon);
  } else {
    vector<co_ord> polygons = {polygon};
    target_map.insert(pair<unsigned int, vector<co_ord>>(key, polygons));
  }
}